

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O0

void initializeLibxml2(void)

{
  int iVar1;
  undefined4 *puVar2;
  
  puVar2 = (undefined4 *)__xmlGetWarningsDefaultValue();
  *puVar2 = 0;
  xmlPedanticParserDefault(0);
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  xmlInitParser();
  xmlSetExternalEntityLoader(testExternalEntityLoader);
  xmlSetStructuredErrorFunc(0,testStructuredErrorHandler);
  iVar1 = xmlRegisterInputCallbacks(hugeMatch,hugeOpen,hugeRead,hugeClose);
  if (iVar1 < 0) {
    fprintf(_stderr,"failed to register Huge handler\n");
    exit(1);
  }
  return;
}

Assistant:

static void
initializeLibxml2(void) {
    xmlGetWarningsDefaultValue = 0;
    xmlPedanticParserDefault(0);

    xmlMemSetup(xmlMemFree, xmlMemMalloc, xmlMemRealloc, xmlMemoryStrdup);
    xmlInitParser();
    xmlSetExternalEntityLoader(testExternalEntityLoader);
    xmlSetStructuredErrorFunc(NULL, testStructuredErrorHandler);
    /*
     * register the new I/O handlers
     */
    if (xmlRegisterInputCallbacks(hugeMatch, hugeOpen,
                                  hugeRead, hugeClose) < 0) {
        fprintf(stderr, "failed to register Huge handler\n");
	exit(1);
    }
}